

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

string cs_impl::to_string_if<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>,false>::
       to_string_abi_cxx11_(shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl> *param_1)

{
  proxy *in_RDI;
  char *in_stack_000003e8;
  any *__lhs;
  any local_50 [4];
  string local_30 [48];
  
  get_name_of_type<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>();
  __lhs = local_50;
  cxx_demangle_abi_cxx11_(in_stack_000003e8);
  std::operator+((char *)__lhs,(any *)in_RDI);
  std::operator+(__lhs,&in_RDI->is_rvalue);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)local_50);
  return (string)in_RDI;
}

Assistant:

static std::string to_string(const T &)
		{
			return "[" + cxx_demangle(get_name_of_type<T>()) + "]";
		}